

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

PyObject * pybind11::cpp_function::dispatcher(PyObject *self,PyObject *args_in,PyObject *kwargs_in)

{
  uint __val;
  pointer paVar1;
  bool bVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  PyMethodDef *pPVar5;
  PyTypeObject **ppPVar6;
  argument_record aVar7;
  uint uVar8;
  int iVar9;
  function_record *pfVar10;
  long lVar11;
  undefined8 extraout_RAX;
  handle hVar12;
  undefined8 *puVar13;
  type_info *ptVar14;
  long *plVar15;
  long lVar16;
  function_record *pfVar17;
  function_record *pfVar18;
  object *poVar19;
  handle hVar20;
  error_already_set *this;
  byte bVar21;
  ulong uVar22;
  ulong uVar23;
  function_record *index;
  uint __len;
  pointer paVar24;
  uint __uval;
  uint uVar25;
  bool bVar26;
  handle arg;
  tuple extra_args;
  vector<bool,_std::allocator<bool>_> second_pass_convert;
  function_call call;
  vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
  second_pass;
  dict kwargs;
  undefined1 local_188 [24];
  object oStack_170;
  PyMethodDef *local_168;
  handle local_160;
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  PyMethodDef *local_138;
  undefined4 local_12c;
  undefined1 local_128 [8];
  undefined1 local_120 [16];
  handle *phStack_110;
  undefined1 auStack_108 [16];
  function_record *local_f8;
  handle hStack_f0;
  PyMethodDef *local_e8;
  handle local_e0;
  handle local_d8;
  function_record *local_d0;
  undefined1 local_c8 [32];
  PyObject *local_a8;
  handle local_a0;
  long local_98;
  PyObject local_90;
  ulong local_80;
  uint local_74;
  ulong local_70;
  ulong local_68;
  PyTypeObject *local_58;
  function_record *local_50;
  PyTypeObject **local_48;
  handle local_40;
  object local_38;
  
  pfVar10 = (function_record *)PyCapsule_GetPointer(self,0);
  if ((args_in->ob_type->tp_flags & 0x4000000) == 0) {
    __assert_fail("PyTuple_Check(args_in)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/shibasisp[P]pybind11-examples/pybind11/include/pybind11/pybind11.h"
                  ,0x1a0,
                  "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                 );
  }
  local_80 = args_in[1].ob_refcnt;
  if (local_80 == 0) {
    local_58 = (PyTypeObject *)0x0;
  }
  else {
    local_58 = args_in[1].ob_type;
  }
  local_c8._0_8_ = (PyObject *)0x0;
  local_c8._8_8_ = (function_record *)0x0;
  local_c8._16_8_ = (pointer)0x0;
  hVar20.m_ptr = (PyObject *)pfVar10;
  local_d8.m_ptr = (PyObject *)pfVar10;
  local_d0 = (function_record *)kwargs_in;
  local_50 = (function_record *)args_in;
  if (pfVar10 == (function_record *)0x0) {
    local_12c = 0;
    local_a8 = (PyObject *)0x1;
  }
  else {
    local_12c = (undefined4)
                CONCAT71((int7)((ulong)local_58 >> 8),pfVar10->next != (function_record *)0x0);
    local_48 = &args_in[1].ob_type;
    local_a8 = (PyObject *)0x1;
    do {
      bVar21 = (pfVar10->field_0x59 & 8) >> 3;
      uVar23 = (long)((char)(pfVar10->field_0x59 << 3) >> 7) +
               ((ulong)pfVar10->nargs - (ulong)bVar21);
      if (((bVar21 == 0) && (uVar23 < local_80)) ||
         ((local_80 < uVar23 &&
          ((ulong)((long)(pfVar10->args).
                         super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pfVar10->args).
                         super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5) < uVar23)))) {
        bVar26 = false;
      }
      else {
        local_f8 = (function_record *)0x0;
        hStack_f0.m_ptr = hStack_f0.m_ptr & 0xffffffff00000000;
        local_e8 = (PyMethodDef *)0x0;
        auStack_108._8_8_ = auStack_108._8_8_ & 0xffffffff00000000;
        phStack_110 = (handle *)0x0;
        auStack_108._0_8_ = (function_record *)0x0;
        local_120._0_8_ = (pointer)0x0;
        local_120._8_8_ = (handle *)0x0;
        local_e0.m_ptr = (PyObject *)local_58;
        local_128 = (undefined1  [8])pfVar10;
        std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::reserve
                  ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)local_120,
                   (ulong)pfVar10->nargs);
        std::vector<bool,_std::allocator<bool>_>::reserve
                  ((vector<bool,_std::allocator<bool>_> *)auStack_108,(ulong)pfVar10->nargs);
        local_68 = uVar23;
        if (local_80 < uVar23) {
          local_68 = local_80;
        }
        local_70 = uVar23;
        if (local_68 == 0) {
          uVar23 = 0;
          bVar26 = false;
        }
        else {
          lVar16 = 0;
          uVar23 = 0;
          bVar26 = false;
          do {
            paVar1 = (pfVar10->args).
                     super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            paVar24 = paVar1 + lVar16;
            if ((ulong)((long)(pfVar10->args).
                              super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)paVar1 >> 5) <=
                uVar23) {
              paVar24 = (pointer)0x0;
            }
            if (((((function_record *)kwargs_in == (function_record *)0x0) ||
                 (paVar24 == (pointer)0x0)) || (*(long *)paVar24 == 0)) ||
               (lVar11 = PyDict_GetItemString(kwargs_in), lVar11 == 0)) {
              if ((((PyTypeObject *)
                   (((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)&local_50->doc)
                   ->super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>).
                   _M_impl.super__Vector_impl_data._M_start)->tp_flags & 0x4000000) == 0) {
                __assert_fail("PyTuple_Check(args_in)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/shibasisp[P]pybind11-examples/pybind11/include/pybind11/pybind11.h"
                              ,0x1dd,
                              "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                             );
              }
              local_188._0_8_ = local_50->data[uVar23 - 4];
              if (((paVar24 == (pointer)0x0) || (((byte)paVar24[0x18] & 2) != 0)) ||
                 ((function_record *)local_188._0_8_ != (function_record *)&_Py_NoneStruct)) {
                if ((handle *)local_120._8_8_ == phStack_110) {
                  std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
                  _M_realloc_insert<pybind11::handle_const&>
                            ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)local_120,
                             (iterator)local_120._8_8_,(handle *)local_188);
                }
                else {
                  *(PyObject **)local_120._8_8_ = (PyObject *)local_188._0_8_;
                  local_120._8_8_ = local_120._8_8_ + 8;
                }
                bVar2 = true;
                aVar7 = (argument_record)0x1;
                if (paVar24 != (pointer)0x0) {
                  aVar7 = paVar24[0x18];
                }
                std::vector<bool,_std::allocator<bool>_>::push_back
                          ((vector<bool,_std::allocator<bool>_> *)auStack_108,
                           (bool)((byte)aVar7 & 1));
              }
              else {
                bVar2 = false;
                bVar26 = true;
              }
            }
            else {
              bVar26 = true;
              bVar2 = false;
            }
            kwargs_in = (PyObject *)local_d0;
            if (!bVar2) break;
            uVar23 = uVar23 + 1;
            lVar16 = lVar16 + 0x20;
          } while (local_68 != uVar23);
        }
        if (bVar26) {
          bVar26 = false;
          hVar20.m_ptr = local_d8.m_ptr;
        }
        else {
          if ((function_record *)kwargs_in != (function_record *)0x0) {
            ((function_record *)kwargs_in)->name =
                 (char *)((long)&((function_record *)((function_record *)kwargs_in)->name)->name + 1
                         );
          }
          local_a0.m_ptr = kwargs_in;
          if (uVar23 < local_70) {
            lVar16 = uVar23 << 5;
            bVar26 = true;
            local_74 = 0;
            do {
              paVar1 = (pfVar10->args).
                       super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_188._0_8_ = (function_record *)0x0;
              if (((function_record *)kwargs_in != (function_record *)0x0) &&
                 (*(long *)(paVar1 + lVar16) != 0)) {
                local_188._0_8_ = PyDict_GetItemString(local_a0.m_ptr);
              }
              if ((function_record *)local_188._0_8_ == (function_record *)0x0) {
                if (*(long *)(paVar1 + lVar16 + 0x10) != 0) {
                  local_188._0_8_ = *(undefined8 *)(paVar1 + lVar16 + 0x10);
                }
              }
              else {
                if ((local_74 & 1) == 0) {
                  local_158._0_8_ = PyDict_Copy(local_a0.m_ptr);
                  object::operator=((object *)&local_a0,(object *)local_158);
                  object::~object((object *)local_158);
                  local_74 = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
                }
                PyDict_DelItemString(local_a0.m_ptr);
              }
              uVar3 = local_188._0_8_;
              if ((function_record *)local_188._0_8_ == (function_record *)0x0) {
LAB_00114fac:
                kwargs_in = (PyObject *)local_d0;
                if (bVar26) {
                  bVar26 = false;
                  hVar20.m_ptr = local_d8.m_ptr;
                  goto LAB_00115414;
                }
                break;
              }
              if ((handle *)local_120._8_8_ == phStack_110) {
                std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
                _M_realloc_insert<pybind11::handle_const&>
                          ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)local_120,
                           (iterator)local_120._8_8_,(handle *)local_188);
              }
              else {
                *(PyObject **)local_120._8_8_ = (PyObject *)local_188._0_8_;
                local_120._8_8_ = local_120._8_8_ + 8;
              }
              std::vector<bool,_std::allocator<bool>_>::push_back
                        ((vector<bool,_std::allocator<bool>_> *)auStack_108,
                         (bool)((byte)paVar1[lVar16 + 0x18] & 1));
              if ((function_record *)uVar3 == (function_record *)0x0) goto LAB_00114fac;
              uVar23 = uVar23 + 1;
              lVar16 = lVar16 + 0x20;
              bVar26 = uVar23 < local_70;
              kwargs_in = (PyObject *)local_d0;
            } while (bVar26);
          }
          pfVar17 = local_50;
          hVar20.m_ptr = local_d8.m_ptr;
          if ((((function_record *)local_a0.m_ptr == (function_record *)0x0) ||
              (lVar16 = PyDict_Size(), lVar16 == 0)) || ((pfVar10->field_0x59 & 0x10) != 0)) {
            tuple::tuple((tuple *)&local_160,0);
            if ((pfVar10->field_0x59 & 8) != 0) {
              if (local_68 == 0) {
                local_188._0_8_ = pfVar17;
                if (pfVar17 != (function_record *)0x0) {
                  pfVar17->name = (char *)((long)&((function_record *)pfVar17->name)->name + 1);
                }
LAB_001150ed:
                object::operator=((object *)&local_160,(object *)local_188);
                object::~object((object *)local_188);
              }
              else {
                pfVar18 = (function_record *)(local_80 - uVar23);
                if (local_80 < uVar23 || pfVar18 == (function_record *)0x0) {
                  tuple::tuple((tuple *)local_188,0);
                  goto LAB_001150ed;
                }
                tuple::tuple((tuple *)local_188,(size_t)pfVar18);
                object::operator=((object *)&local_160,(object *)local_188);
                object::~object((object *)local_188);
                ppPVar6 = local_48;
                if (local_80 != uVar23) {
                  index = (function_record *)0x0;
                  do {
                    if ((((PyTypeObject *)
                         (((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
                          &pfVar17->doc)->
                         super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>).
                         _M_impl.super__Vector_impl_data._M_start)->tp_flags & 0x4000000) == 0) {
                      __assert_fail("PyTuple_Check(args_in)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/shibasisp[P]pybind11-examples/pybind11/include/pybind11/pybind11.h"
                                    ,0x21e,
                                    "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                                   );
                    }
                    hVar12.m_ptr = (PyObject *)ppPVar6[(long)((long)&index->name + uVar23)];
                    if (hVar12.m_ptr != (PyObject *)0x0) {
                      (hVar12.m_ptr)->ob_refcnt = (hVar12.m_ptr)->ob_refcnt + 1;
                    }
                    local_188._8_8_ = local_160.m_ptr;
                    oStack_170.super_handle.m_ptr = (handle)(PyObject *)0x0;
                    local_188._16_8_ = index;
                    detail::accessor_policies::tuple_item::set(local_160,(size_t)index,hVar12);
                    object::~object((object *)(local_188 + 0x18));
                    index = (function_record *)((long)&index->name + 1);
                  } while (pfVar18 != index);
                }
              }
              if ((handle *)local_120._8_8_ == phStack_110) {
                std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
                _M_realloc_insert<pybind11::handle_const&>
                          ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)local_120,
                           (iterator)local_120._8_8_,&local_160);
              }
              else {
                *(PyObject **)local_120._8_8_ = local_160.m_ptr;
                local_120._8_8_ = local_120._8_8_ + 8;
              }
              kwargs_in = (PyObject *)local_d0;
              std::vector<bool,_std::allocator<bool>_>::push_back
                        ((vector<bool,_std::allocator<bool>_> *)auStack_108,false);
            }
            if ((pfVar10->field_0x59 & 0x10) != 0) {
              if ((function_record *)local_a0.m_ptr == (function_record *)0x0) {
                dict::dict((dict *)local_188);
                object::operator=((object *)&local_a0,(object *)local_188);
                object::~object((object *)local_188);
              }
              if ((handle *)local_120._8_8_ == phStack_110) {
                std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
                _M_realloc_insert<pybind11::handle_const&>
                          ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)local_120,
                           (iterator)local_120._8_8_,&local_a0);
              }
              else {
                *(PyObject **)local_120._8_8_ = local_a0.m_ptr;
                local_120._8_8_ = local_120._8_8_ + 8;
              }
              std::vector<bool,_std::allocator<bool>_>::push_back
                        ((vector<bool,_std::allocator<bool>_> *)auStack_108,false);
            }
            uVar23 = (ulong)pfVar10->nargs;
            if (((long)(local_120._8_8_ - local_120._0_8_) >> 3 != uVar23) ||
               (((ulong)hStack_f0.m_ptr & 0xffffffff) + ((long)local_f8 - auStack_108._0_8_) * 8 !=
                uVar23)) {
              pybind11_fail(
                           "Internal error: function call dispatcher inserted wrong number of arguments!"
                           );
            }
            local_158._0_8_ = (PyObject *)0x0;
            local_158._8_8_ = local_158._8_8_ & 0xffffffff00000000;
            local_148._0_8_ = (function_record *)0x0;
            local_148._8_8_ = local_148._8_8_ & 0xffffffff00000000;
            local_138 = (PyMethodDef *)0x0;
            if ((byte)local_12c != '\0') {
              std::vector<bool,_std::allocator<bool>_>::resize
                        ((vector<bool,_std::allocator<bool>_> *)local_158,uVar23,false);
              pPVar5 = local_e8;
              hVar12.m_ptr = hStack_f0.m_ptr;
              pfVar17 = local_f8;
              uVar4 = auStack_108._8_8_;
              uVar3 = auStack_108._0_8_;
              local_168 = local_e8;
              local_188._16_8_ = local_f8;
              oStack_170.super_handle.m_ptr = (handle)(handle)hStack_f0.m_ptr;
              local_188._0_8_ = auStack_108._0_8_;
              local_188._8_8_ = auStack_108._8_8_;
              local_e8 = local_138;
              local_f8 = (function_record *)local_148._0_8_;
              hStack_f0.m_ptr = (PyObject *)local_148._8_8_;
              auStack_108._0_8_ = local_158._0_8_;
              auStack_108._8_8_ = local_158._8_8_;
              local_158._0_8_ = uVar3;
              local_158._8_8_ = uVar4;
              local_148._0_8_ = pfVar17;
              local_148._8_8_ = hVar12.m_ptr;
              local_138 = pPVar5;
            }
            local_a8 = (PyObject *)(*pfVar10->impl)((function_call *)local_128);
            pPVar5 = local_e8;
            hVar12.m_ptr = hStack_f0.m_ptr;
            pfVar17 = local_f8;
            uVar4 = auStack_108._8_8_;
            uVar3 = auStack_108._0_8_;
            bVar26 = local_a8 != (PyObject *)0x1;
            if (((byte)local_12c & local_a8 == (PyObject *)0x1) != 0) {
              bVar26 = false;
              for (uVar23 = (ulong)((byte)pfVar10->field_0x59 >> 5 & 1); uVar23 < local_70;
                  uVar23 = uVar23 + 1) {
                uVar22 = uVar23 + 0x3f;
                if (-1 < (long)uVar23) {
                  uVar22 = uVar23;
                }
                if ((*(ulong *)(local_158._0_8_ +
                               (ulong)((uVar23 & 0x800000000000003f) < 0x8000000000000001) * 8 +
                               ((long)uVar22 >> 6) * 8 + -8) >> (uVar23 & 0x3f) & 1) != 0) {
                  local_168 = local_e8;
                  local_188._16_8_ = local_f8;
                  oStack_170.super_handle.m_ptr = (handle)(handle)hStack_f0.m_ptr;
                  local_188._0_8_ = auStack_108._0_8_;
                  local_188._8_8_ = auStack_108._8_8_;
                  bVar26 = false;
                  local_e8 = local_138;
                  local_f8 = (function_record *)local_148._0_8_;
                  hStack_f0.m_ptr = (PyObject *)local_148._8_8_;
                  auStack_108._0_8_ = local_158._0_8_;
                  auStack_108._8_8_ = local_158._8_8_;
                  local_158._0_8_ = uVar3;
                  local_158._8_8_ = uVar4;
                  local_148._0_8_ = pfVar17;
                  local_148._8_8_ = hVar12.m_ptr;
                  local_138 = pPVar5;
                  std::
                  vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                  ::emplace_back<pybind11::detail::function_call>
                            ((vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                              *)local_c8,(function_call *)local_128);
                  break;
                }
              }
            }
            if ((function_record *)local_158._0_8_ != (function_record *)0x0) {
              operator_delete((void *)local_158._0_8_,(long)local_138 - local_158._0_8_);
              local_158._0_8_ = (PyObject *)0x0;
              local_158._8_8_ = local_158._8_8_ & 0xffffffff00000000;
              local_148._0_8_ = (function_record *)0x0;
              local_148._8_8_ = local_148._8_8_ & 0xffffffff00000000;
              local_138 = (PyMethodDef *)0x0;
            }
            object::~object((object *)&local_160);
          }
          else {
            bVar26 = false;
          }
LAB_00115414:
          object::~object((object *)&local_a0);
        }
        if ((function_record *)auStack_108._0_8_ != (function_record *)0x0) {
          operator_delete((void *)auStack_108._0_8_,(long)local_e8 - auStack_108._0_8_);
          auStack_108._0_8_ = (function_record *)0x0;
          auStack_108._8_8_ = auStack_108._8_8_ & 0xffffffff00000000;
          local_f8 = (function_record *)0x0;
          hStack_f0.m_ptr = hStack_f0.m_ptr & 0xffffffff00000000;
          local_e8 = (PyMethodDef *)0x0;
        }
        if ((pointer)local_120._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_120._0_8_,(long)phStack_110 - local_120._0_8_);
        }
      }
    } while ((!bVar26) && (pfVar10 = pfVar10->next, pfVar10 != (function_record *)0x0));
  }
  uVar3 = local_c8._8_8_;
  hVar12.m_ptr = local_a8;
  if (((byte)local_12c != '\0') &&
     ((local_c8._0_8_ != local_c8._8_8_ &&
      (pfVar10 = (function_record *)local_c8._0_8_, local_a8 == (PyObject *)0x1)))) {
    do {
      hVar12 = (*((function_record *)pfVar10->name)->impl)((function_call *)pfVar10);
      if (hVar12.m_ptr != (PyObject *)0x1) break;
      pfVar10 = (function_record *)&pfVar10->free_data;
    } while (pfVar10 != (function_record *)uVar3);
  }
  std::vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>::
  ~vector((vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
           *)local_c8);
  if (hVar12.m_ptr == (PyObject *)0x0) {
    local_128 = (undefined1  [8])(local_120 + 8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,
               "Unable to convert function return value to a Python type! The signature was\n\t","")
    ;
    std::__cxx11::string::append(local_128);
    PyErr_SetString(_PyExc_TypeError,local_128);
    if (local_128 == (undefined1  [8])(local_120 + 8)) {
      return (PyObject *)0x0;
    }
    goto LAB_00115e2c;
  }
  if (hVar12.m_ptr != (PyObject *)0x1) {
    if ((((function_record *)hVar20.m_ptr)->field_0x59 & 1) != 0) {
      ptVar14 = detail::get_type_info
                          ((PyTypeObject *)(((function_record *)hVar20.m_ptr)->scope).m_ptr);
      (*ptVar14->init_holder)((instance *)local_58,(void *)0x0);
      return hVar12.m_ptr;
    }
    return hVar12.m_ptr;
  }
  if ((((function_record *)hVar20.m_ptr)->field_0x59 & 4) != 0) {
    __Py_NotImplementedStruct = __Py_NotImplementedStruct + 1;
    return (PyObject *)&_Py_NotImplementedStruct;
  }
  std::__cxx11::string::string
            ((string *)local_c8,((function_record *)hVar20.m_ptr)->name,(allocator *)&local_160);
  puVar13 = (undefined8 *)std::__cxx11::string::append(local_c8);
  local_158._0_8_ = local_148;
  pfVar10 = (function_record *)(puVar13 + 2);
  if ((function_record *)*puVar13 == pfVar10) {
    local_148._0_8_ = pfVar10->name;
    local_148._8_8_ = puVar13[3];
  }
  else {
    local_148._0_8_ = pfVar10->name;
    local_158._0_8_ = (PyObject *)*puVar13;
  }
  local_158._8_8_ = puVar13[1];
  *puVar13 = pfVar10;
  puVar13[1] = 0;
  *(undefined1 *)(puVar13 + 2) = 0;
  iVar9 = 0x11bd9c;
  if ((((function_record *)hVar20.m_ptr)->field_0x59 & 1) != 0) {
    iVar9 = 0x11bd90;
  }
  local_a0.m_ptr = &local_90;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a0,iVar9,
             iVar9 + ((byte)((function_record *)hVar20.m_ptr)->field_0x59 & 1) * 3 + 8);
  pfVar10 = (function_record *)((long)(function_record **)local_158._8_8_ + local_98);
  pfVar17 = (function_record *)0xf;
  if ((function_record *)local_158._0_8_ != (function_record *)local_148) {
    pfVar17 = (function_record *)local_148._0_8_;
  }
  if (pfVar17 < pfVar10) {
    pfVar17 = (function_record *)0xf;
    if (local_a0.m_ptr != &local_90) {
      pfVar17 = (function_record *)local_90.ob_refcnt;
    }
    if (pfVar17 < pfVar10) goto LAB_00115710;
    puVar13 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,local_158._0_8_);
  }
  else {
LAB_00115710:
    puVar13 = (undefined8 *)std::__cxx11::string::_M_append(local_158,(ulong)local_a0.m_ptr);
  }
  local_188._0_8_ = local_188 + 0x10;
  pfVar10 = (function_record *)(puVar13 + 2);
  if ((function_record *)*puVar13 == pfVar10) {
    local_188._16_8_ = pfVar10->name;
    oStack_170.super_handle.m_ptr = (handle)puVar13[3];
  }
  else {
    local_188._16_8_ = pfVar10->name;
    local_188._0_8_ = (function_record *)*puVar13;
  }
  local_188._8_8_ = puVar13[1];
  *puVar13 = pfVar10;
  puVar13[1] = 0;
  *(undefined1 *)&pfVar10->name = 0;
  plVar15 = (long *)std::__cxx11::string::append(local_188);
  local_128 = (undefined1  [8])(local_120 + 8);
  pfVar10 = (function_record *)(plVar15 + 2);
  if ((function_record *)*plVar15 == pfVar10) {
    local_120._8_8_ = pfVar10->name;
    phStack_110 = (handle *)plVar15[3];
  }
  else {
    local_120._8_8_ = pfVar10->name;
    local_128 = (undefined1  [8])*plVar15;
  }
  local_120._0_8_ = plVar15[1];
  *plVar15 = (long)pfVar10;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  if ((function_record *)local_188._0_8_ != (function_record *)(local_188 + 0x10)) {
    operator_delete((void *)local_188._0_8_,(ulong)(local_188._16_8_ + 1));
  }
  if (local_a0.m_ptr != &local_90) {
    operator_delete(local_a0.m_ptr,(ulong)((long)(char **)local_90.ob_refcnt + 1));
  }
  if ((function_record *)local_158._0_8_ != (function_record *)local_148) {
    operator_delete((void *)local_158._0_8_,(ulong)(local_148._0_8_ + 1));
  }
  if ((function_record *)local_c8._0_8_ != (function_record *)(local_c8 + 0x10)) {
    operator_delete((void *)local_c8._0_8_,(ulong)((long)(function_record **)local_c8._16_8_ + 1));
  }
  hVar20.m_ptr = local_d8.m_ptr;
  uVar25 = 0;
  do {
    __val = uVar25 + 1;
    __len = 1;
    if (8 < uVar25) {
      uVar23 = (ulong)__val;
      uVar25 = 4;
      do {
        __len = uVar25;
        uVar8 = (uint)uVar23;
        if (uVar8 < 100) {
          __len = __len - 2;
          goto LAB_001158a8;
        }
        if (uVar8 < 1000) {
          __len = __len - 1;
          goto LAB_001158a8;
        }
        if (uVar8 < 10000) goto LAB_001158a8;
        uVar23 = uVar23 / 10000;
        uVar25 = __len + 4;
      } while (99999 < uVar8);
      __len = __len + 1;
    }
LAB_001158a8:
    local_c8._0_8_ = local_c8 + 0x10;
    std::__cxx11::string::_M_construct((ulong)local_c8,(char)__len);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_c8._0_8_,__len,__val);
    puVar13 = (undefined8 *)std::__cxx11::string::replace((ulong)local_c8,0,(char *)0x0,0x11bdde);
    local_158._0_8_ = local_148;
    pfVar10 = (function_record *)(puVar13 + 2);
    if ((function_record *)*puVar13 == pfVar10) {
      local_148._0_8_ = pfVar10->name;
      local_148._8_8_ = puVar13[3];
    }
    else {
      local_148._0_8_ = pfVar10->name;
      local_158._0_8_ = (PyObject *)*puVar13;
    }
    local_158._8_8_ = puVar13[1];
    *puVar13 = pfVar10;
    puVar13[1] = 0;
    *(undefined1 *)(puVar13 + 2) = 0;
    puVar13 = (undefined8 *)std::__cxx11::string::append(local_158);
    local_188._0_8_ = local_188 + 0x10;
    pfVar10 = (function_record *)(puVar13 + 2);
    if ((function_record *)*puVar13 == pfVar10) {
      local_188._16_8_ = pfVar10->name;
      oStack_170.super_handle.m_ptr = (handle)puVar13[3];
    }
    else {
      local_188._16_8_ = pfVar10->name;
      local_188._0_8_ = (function_record *)*puVar13;
    }
    local_188._8_8_ = puVar13[1];
    *puVar13 = pfVar10;
    puVar13[1] = 0;
    *(undefined1 *)(puVar13 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_128,local_188._0_8_);
    if ((function_record *)local_188._0_8_ != (function_record *)(local_188 + 0x10)) {
      operator_delete((void *)local_188._0_8_,(ulong)(local_188._16_8_ + 1));
    }
    if ((function_record *)local_158._0_8_ != (function_record *)local_148) {
      operator_delete((void *)local_158._0_8_,(ulong)(local_148._0_8_ + 1));
    }
    if ((function_record *)local_c8._0_8_ != (function_record *)(local_c8 + 0x10)) {
      operator_delete((void *)local_c8._0_8_,(ulong)((long)(function_record **)local_c8._16_8_ + 1))
      ;
    }
    if (((ulong)local_d8.m_ptr[5].ob_type & 0x100) == 0) {
LAB_00115b2a:
      std::__cxx11::string::append((char *)local_128);
    }
    else {
      std::__cxx11::string::string
                ((string *)local_188,((function_record *)hVar20.m_ptr)->signature,
                 (allocator *)local_158);
      lVar16 = std::__cxx11::string::find((char)local_188,0x28);
      pfVar10 = (function_record *)(lVar16 + 7);
      if ((ulong)local_188._8_8_ <= pfVar10) {
LAB_00115b0f:
        if ((function_record *)local_188._0_8_ != (function_record *)(local_188 + 0x10)) {
          operator_delete((void *)local_188._0_8_,(ulong)(local_188._16_8_ + 1));
        }
        goto LAB_00115b2a;
      }
      pfVar17 = (function_record *)std::__cxx11::string::find(local_188,0x11bde3,0);
      local_68 = std::__cxx11::string::rfind(local_188,0x11bde6,0xffffffffffffffff);
      if (pfVar17 < (ulong)local_188._8_8_) {
        pfVar18 = (function_record *)((long)&pfVar17->name + 2);
      }
      else {
        pfVar18 = (function_record *)std::__cxx11::string::find((char)local_188,0x29);
        pfVar17 = pfVar18;
      }
      if ((pfVar17 <= pfVar10) || ((ulong)local_188._8_8_ <= pfVar18)) goto LAB_00115b0f;
      std::__cxx11::string::append((string *)local_128,(ulong)local_188,(ulong)pfVar10);
      std::__cxx11::string::push_back((char)(string *)local_128);
      std::__cxx11::string::append((string *)local_128,(ulong)local_188,(ulong)pfVar18);
      if ((function_record *)local_188._0_8_ != (function_record *)(local_188 + 0x10)) {
        operator_delete((void *)local_188._0_8_,(ulong)(local_188._16_8_ + 1));
      }
    }
    std::__cxx11::string::append((char *)local_128);
    hVar20.m_ptr = (PyObject *)((function_record *)hVar20.m_ptr)->next;
    uVar25 = __val;
  } while ((function_record *)hVar20.m_ptr != (function_record *)0x0);
  std::__cxx11::string::append(local_128);
  local_a0.m_ptr = (PyObject *)local_50;
  if (local_50 != (function_record *)0x0) {
    local_50->name = (char *)((long)&((function_record *)local_50->name)->name + 1);
  }
  bVar26 = false;
  for (pfVar10 = (function_record *)
                 (ulong)((byte)*(undefined1 *)((long)&local_d8.m_ptr[5].ob_type + 1) & 1);
      pfVar17 = (function_record *)PyTuple_Size(local_a0.m_ptr), pfVar10 < pfVar17;
      pfVar10 = (function_record *)((long)&pfVar10->name + 1)) {
    bVar2 = true;
    if (bVar26) {
      std::__cxx11::string::append(local_128);
      bVar2 = bVar26;
    }
    bVar26 = bVar2;
    local_158._8_8_ = local_a0.m_ptr;
    local_148._8_8_ = (PyObject *)0x0;
    local_148._0_8_ = pfVar10;
    poVar19 = detail::accessor<pybind11::detail::accessor_policies::tuple_item>::get_cache
                        ((accessor<pybind11::detail::accessor_policies::tuple_item> *)local_158);
    local_160.m_ptr = (poVar19->super_handle).m_ptr;
    if ((function_record *)local_160.m_ptr != (function_record *)0x0) {
      ((function_record *)local_160.m_ptr)->name =
           (char *)((long)&((function_record *)((function_record *)local_160.m_ptr)->name)->name + 1
                   );
    }
    hVar20.m_ptr = (PyObject *)PyObject_Repr(local_160.m_ptr);
    if ((function_record *)hVar20.m_ptr == (function_record *)0x0) {
      this = (error_already_set *)__cxa_allocate_exception(0x28);
      error_already_set::error_already_set(this);
      __cxa_throw(this,&error_already_set::typeinfo,error_already_set::~error_already_set);
    }
    local_c8._0_8_ = hVar20.m_ptr;
    str::operator_cast_to_string((string *)local_188,(str *)local_c8);
    std::__cxx11::string::_M_append(local_128,local_188._0_8_);
    if ((function_record *)local_188._0_8_ != (function_record *)(local_188 + 0x10)) {
      operator_delete((void *)local_188._0_8_,(ulong)(local_188._16_8_ + 1));
    }
    object::~object((object *)local_c8);
    object::~object((object *)&local_160);
    object::~object((object *)(local_148 + 8));
  }
  if (local_d0 != (function_record *)0x0) {
    local_160.m_ptr = (PyObject *)local_d0;
    local_d0->name = (char *)((long)&((function_record *)local_d0->name)->name + 1);
    lVar16 = PyDict_Size();
    if (lVar16 != 0) {
      if (bVar26) {
        std::__cxx11::string::append(local_128);
      }
      std::__cxx11::string::append(local_128);
      local_188._0_8_ = local_160.m_ptr;
      oStack_170.super_handle.m_ptr = (handle)(PyObject *)0x0;
      iVar9 = PyDict_Next(local_160.m_ptr,local_188 + 0x18,local_188 + 8,local_188 + 0x10);
      if (iVar9 == 0) {
        oStack_170.super_handle.m_ptr = (handle)(PyObject *)0xffffffffffffffff;
      }
      if (oStack_170.super_handle.m_ptr != (PyObject *)0xffffffffffffffff) {
        bVar26 = true;
        do {
          local_c8._0_8_ = local_188._8_8_;
          local_c8._8_8_ = local_188._16_8_;
          if (bVar26) {
            bVar26 = false;
          }
          else {
            std::__cxx11::string::append(local_128);
          }
          str::str((str *)&local_40,"{}={!r}");
          str::format<pybind11::handle&,pybind11::handle&>
                    ((str *)&local_38,&local_40,(handle *)local_c8);
          str::operator_cast_to_string((string *)local_158,(str *)&local_38);
          std::__cxx11::string::_M_append(local_128,local_158._0_8_);
          if ((function_record *)local_158._0_8_ != (function_record *)local_148) {
            operator_delete((void *)local_158._0_8_,(ulong)(local_148._0_8_ + 1));
          }
          object::~object(&local_38);
          object::~object((object *)&local_40);
          iVar9 = PyDict_Next(local_188._0_8_,local_188 + 0x18,local_188 + 8,local_188 + 0x10);
          if (iVar9 == 0) {
            oStack_170.super_handle.m_ptr = (handle)(PyObject *)0xffffffffffffffff;
          }
        } while (oStack_170.super_handle.m_ptr != (PyObject *)0xffffffffffffffff);
      }
    }
    object::~object((object *)&local_160);
  }
  PyErr_SetString(_PyExc_TypeError,local_128);
  object::~object((object *)&local_a0);
  if (local_128 == (undefined1  [8])(local_120 + 8)) {
    return (PyObject *)0x0;
  }
LAB_00115e2c:
  operator_delete((void *)local_128,(ulong)((long)(PyObject **)local_120._8_8_ + 1));
  return (PyObject *)0x0;
}

Assistant:

static PyObject *dispatcher(PyObject *self, PyObject *args_in, PyObject *kwargs_in) {
        using namespace detail;

        /* Iterator over the list of potentially admissible overloads */
        function_record *overloads = (function_record *) PyCapsule_GetPointer(self, nullptr),
                        *it = overloads;

        /* Need to know how many arguments + keyword arguments there are to pick the right overload */
        const size_t n_args_in = (size_t) PyTuple_GET_SIZE(args_in);

        handle parent = n_args_in > 0 ? PyTuple_GET_ITEM(args_in, 0) : nullptr,
               result = PYBIND11_TRY_NEXT_OVERLOAD;

        try {
            // We do this in two passes: in the first pass, we load arguments with `convert=false`;
            // in the second, we allow conversion (except for arguments with an explicit
            // py::arg().noconvert()).  This lets us prefer calls without conversion, with
            // conversion as a fallback.
            std::vector<function_call> second_pass;

            // However, if there are no overloads, we can just skip the no-convert pass entirely
            const bool overloaded = it != nullptr && it->next != nullptr;

            for (; it != nullptr; it = it->next) {

                /* For each overload:
                   1. Copy all positional arguments we were given, also checking to make sure that
                      named positional arguments weren't *also* specified via kwarg.
                   2. If we weren't given enough, try to make up the omitted ones by checking
                      whether they were provided by a kwarg matching the `py::arg("name")` name.  If
                      so, use it (and remove it from kwargs; if not, see if the function binding
                      provided a default that we can use.
                   3. Ensure that either all keyword arguments were "consumed", or that the function
                      takes a kwargs argument to accept unconsumed kwargs.
                   4. Any positional arguments still left get put into a tuple (for args), and any
                      leftover kwargs get put into a dict.
                   5. Pack everything into a vector; if we have py::args or py::kwargs, they are an
                      extra tuple or dict at the end of the positional arguments.
                   6. Call the function call dispatcher (function_record::impl)

                   If one of these fail, move on to the next overload and keep trying until we get a
                   result other than PYBIND11_TRY_NEXT_OVERLOAD.
                 */

                function_record &func = *it;
                size_t pos_args = func.nargs;    // Number of positional arguments that we need
                if (func.has_args) --pos_args;   // (but don't count py::args
                if (func.has_kwargs) --pos_args; //  or py::kwargs)

                if (!func.has_args && n_args_in > pos_args)
                    continue; // Too many arguments for this overload

                if (n_args_in < pos_args && func.args.size() < pos_args)
                    continue; // Not enough arguments given, and not enough defaults to fill in the blanks

                function_call call(func, parent);

                size_t args_to_copy = std::min(pos_args, n_args_in);
                size_t args_copied = 0;

                // 1. Copy any position arguments given.
                bool bad_arg = false;
                for (; args_copied < args_to_copy; ++args_copied) {
                    argument_record *arg_rec = args_copied < func.args.size() ? &func.args[args_copied] : nullptr;
                    if (kwargs_in && arg_rec && arg_rec->name && PyDict_GetItemString(kwargs_in, arg_rec->name)) {
                        bad_arg = true;
                        break;
                    }

                    handle arg(PyTuple_GET_ITEM(args_in, args_copied));
                    if (arg_rec && !arg_rec->none && arg.is_none()) {
                        bad_arg = true;
                        break;
                    }
                    call.args.push_back(arg);
                    call.args_convert.push_back(arg_rec ? arg_rec->convert : true);
                }
                if (bad_arg)
                    continue; // Maybe it was meant for another overload (issue #688)

                // We'll need to copy this if we steal some kwargs for defaults
                dict kwargs = reinterpret_borrow<dict>(kwargs_in);

                // 2. Check kwargs and, failing that, defaults that may help complete the list
                if (args_copied < pos_args) {
                    bool copied_kwargs = false;

                    for (; args_copied < pos_args; ++args_copied) {
                        const auto &arg = func.args[args_copied];

                        handle value;
                        if (kwargs_in && arg.name)
                            value = PyDict_GetItemString(kwargs.ptr(), arg.name);

                        if (value) {
                            // Consume a kwargs value
                            if (!copied_kwargs) {
                                kwargs = reinterpret_steal<dict>(PyDict_Copy(kwargs.ptr()));
                                copied_kwargs = true;
                            }
                            PyDict_DelItemString(kwargs.ptr(), arg.name);
                        } else if (arg.value) {
                            value = arg.value;
                        }

                        if (value) {
                            call.args.push_back(value);
                            call.args_convert.push_back(arg.convert);
                        }
                        else
                            break;
                    }

                    if (args_copied < pos_args)
                        continue; // Not enough arguments, defaults, or kwargs to fill the positional arguments
                }

                // 3. Check everything was consumed (unless we have a kwargs arg)
                if (kwargs && kwargs.size() > 0 && !func.has_kwargs)
                    continue; // Unconsumed kwargs, but no py::kwargs argument to accept them

                // 4a. If we have a py::args argument, create a new tuple with leftovers
                tuple extra_args;
                if (func.has_args) {
                    if (args_to_copy == 0) {
                        // We didn't copy out any position arguments from the args_in tuple, so we
                        // can reuse it directly without copying:
                        extra_args = reinterpret_borrow<tuple>(args_in);
                    } else if (args_copied >= n_args_in) {
                        extra_args = tuple(0);
                    } else {
                        size_t args_size = n_args_in - args_copied;
                        extra_args = tuple(args_size);
                        for (size_t i = 0; i < args_size; ++i) {
                            handle item = PyTuple_GET_ITEM(args_in, args_copied + i);
                            extra_args[i] = item.inc_ref().ptr();
                        }
                    }
                    call.args.push_back(extra_args);
                    call.args_convert.push_back(false);
                }

                // 4b. If we have a py::kwargs, pass on any remaining kwargs
                if (func.has_kwargs) {
                    if (!kwargs.ptr())
                        kwargs = dict(); // If we didn't get one, send an empty one
                    call.args.push_back(kwargs);
                    call.args_convert.push_back(false);
                }

                // 5. Put everything in a vector.  Not technically step 5, we've been building it
                // in `call.args` all along.
                #if !defined(NDEBUG)
                if (call.args.size() != func.nargs || call.args_convert.size() != func.nargs)
                    pybind11_fail("Internal error: function call dispatcher inserted wrong number of arguments!");
                #endif

                std::vector<bool> second_pass_convert;
                if (overloaded) {
                    // We're in the first no-convert pass, so swap out the conversion flags for a
                    // set of all-false flags.  If the call fails, we'll swap the flags back in for
                    // the conversion-allowed call below.
                    second_pass_convert.resize(func.nargs, false);
                    call.args_convert.swap(second_pass_convert);
                }

                // 6. Call the function.
                try {
                    result = func.impl(call);
                } catch (reference_cast_error &) {
                    result = PYBIND11_TRY_NEXT_OVERLOAD;
                }

                if (result.ptr() != PYBIND11_TRY_NEXT_OVERLOAD)
                    break;

                if (overloaded) {
                    // The (overloaded) call failed; if the call has at least one argument that
                    // permits conversion (i.e. it hasn't been explicitly specified `.noconvert()`)
                    // then add this call to the list of second pass overloads to try.
                    for (size_t i = func.is_method ? 1 : 0; i < pos_args; i++) {
                        if (second_pass_convert[i]) {
                            // Found one: swap the converting flags back in and store the call for
                            // the second pass.
                            call.args_convert.swap(second_pass_convert);
                            second_pass.push_back(std::move(call));
                            break;
                        }
                    }
                }
            }

            if (overloaded && !second_pass.empty() && result.ptr() == PYBIND11_TRY_NEXT_OVERLOAD) {
                // The no-conversion pass finished without success, try again with conversion allowed
                for (auto &call : second_pass) {
                    try {
                        result = call.func.impl(call);
                    } catch (reference_cast_error &) {
                        result = PYBIND11_TRY_NEXT_OVERLOAD;
                    }

                    if (result.ptr() != PYBIND11_TRY_NEXT_OVERLOAD)
                        break;
                }
            }
        } catch (error_already_set &e) {
            e.restore();
            return nullptr;
        } catch (...) {
            /* When an exception is caught, give each registered exception
               translator a chance to translate it to a Python exception
               in reverse order of registration.

               A translator may choose to do one of the following:

                - catch the exception and call PyErr_SetString or PyErr_SetObject
                  to set a standard (or custom) Python exception, or
                - do nothing and let the exception fall through to the next translator, or
                - delegate translation to the next translator by throwing a new type of exception. */

            auto last_exception = std::current_exception();
            auto &registered_exception_translators = get_internals().registered_exception_translators;
            for (auto& translator : registered_exception_translators) {
                try {
                    translator(last_exception);
                } catch (...) {
                    last_exception = std::current_exception();
                    continue;
                }
                return nullptr;
            }
            PyErr_SetString(PyExc_SystemError, "Exception escaped from default exception translator!");
            return nullptr;
        }

        if (result.ptr() == PYBIND11_TRY_NEXT_OVERLOAD) {
            if (overloads->is_operator)
                return handle(Py_NotImplemented).inc_ref().ptr();

            std::string msg = std::string(overloads->name) + "(): incompatible " +
                std::string(overloads->is_constructor ? "constructor" : "function") +
                " arguments. The following argument types are supported:\n";

            int ctr = 0;
            for (function_record *it2 = overloads; it2 != nullptr; it2 = it2->next) {
                msg += "    "+ std::to_string(++ctr) + ". ";

                bool wrote_sig = false;
                if (overloads->is_constructor) {
                    // For a constructor, rewrite `(self: Object, arg0, ...) -> NoneType` as `Object(arg0, ...)`
                    std::string sig = it2->signature;
                    size_t start = sig.find('(') + 7; // skip "(self: "
                    if (start < sig.size()) {
                        // End at the , for the next argument
                        size_t end = sig.find(", "), next = end + 2;
                        size_t ret = sig.rfind(" -> ");
                        // Or the ), if there is no comma:
                        if (end >= sig.size()) next = end = sig.find(')');
                        if (start < end && next < sig.size()) {
                            msg.append(sig, start, end - start);
                            msg += '(';
                            msg.append(sig, next, ret - next);
                            wrote_sig = true;
                        }
                    }
                }
                if (!wrote_sig) msg += it2->signature;

                msg += "\n";
            }
            msg += "\nInvoked with: ";
            auto args_ = reinterpret_borrow<tuple>(args_in);
            bool some_args = false;
            for (size_t ti = overloads->is_constructor ? 1 : 0; ti < args_.size(); ++ti) {
                if (!some_args) some_args = true;
                else msg += ", ";
                msg += pybind11::repr(args_[ti]);
            }
            if (kwargs_in) {
                auto kwargs = reinterpret_borrow<dict>(kwargs_in);
                if (kwargs.size() > 0) {
                    if (some_args) msg += "; ";
                    msg += "kwargs: ";
                    bool first = true;
                    for (auto kwarg : kwargs) {
                        if (first) first = false;
                        else msg += ", ";
                        msg += pybind11::str("{}={!r}").format(kwarg.first, kwarg.second);
                    }
                }
            }

            PyErr_SetString(PyExc_TypeError, msg.c_str());
            return nullptr;
        } else if (!result) {
            std::string msg = "Unable to convert function return value to a "
                              "Python type! The signature was\n\t";
            msg += it->signature;
            PyErr_SetString(PyExc_TypeError, msg.c_str());
            return nullptr;
        } else {
            if (overloads->is_constructor) {
                auto tinfo = get_type_info((PyTypeObject *) overloads->scope.ptr());
                tinfo->init_holder(reinterpret_cast<instance *>(parent.ptr()), nullptr);
            }
            return result.ptr();
        }
    }